

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O2

llb_build_key_kind_t anon_unknown.dwarf_243886::internalToPublicBuildKeyKind(Kind kind)

{
  return *(llb_build_key_kind_t *)(&DAT_001cd198 + (long)(int)kind * 4);
}

Assistant:

static inline llb_build_key_kind_t internalToPublicBuildKeyKind(const BuildKey::Kind kind) {
  switch (kind) {
    case BuildKey::Kind::Command:
      return llb_build_key_kind_command;
    case BuildKey::Kind::CustomTask:
      return llb_build_key_kind_custom_task;
    case BuildKey::Kind::DirectoryContents:
      return llb_build_key_kind_directory_contents;
    case BuildKey::Kind::FilteredDirectoryContents:
      return llb_build_key_kind_filtered_directory_contents;
    case BuildKey::Kind::DirectoryTreeSignature:
      return llb_build_key_kind_directory_tree_signature;
    case BuildKey::Kind::DirectoryTreeStructureSignature:
      return llb_build_key_kind_directory_tree_structure_signature;
    case BuildKey::Kind::Node:
      return llb_build_key_kind_node;
    case BuildKey::Kind::Stat:
      return llb_build_key_kind_stat;
    case BuildKey::Kind::Target:
      return llb_build_key_kind_target;
    case BuildKey::Kind::Unknown:
      return llb_build_key_kind_unknown;
  }
}